

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilation_context.cpp
# Opt level: O3

char * only_file_name_and_ext(char *path)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = strrchr(path,0x2f);
  pcVar2 = strrchr(path,0x5c);
  if (pcVar1 < pcVar2) {
    pcVar1 = pcVar2;
  }
  pcVar2 = pcVar1 + 1;
  if (pcVar1 == (char *)0x0) {
    pcVar2 = path;
  }
  return pcVar2;
}

Assistant:

static const char * only_file_name_and_ext(const char * path)
{
  const char * s1 = strrchr(path, '/');
  const char * s2 = strrchr(path, '\\');
  if (s2 > s1)
    s1 = s2;

  return s1 ? s1 + 1 : path;
}